

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O0

void lograw(uchar *buffer,ssize_t len)

{
  int iVar1;
  uint local_d4;
  int local_bc;
  long lStack_b8;
  int left;
  ssize_t width;
  char *optr;
  uchar *ptr;
  ssize_t i;
  char data [120];
  ssize_t len_local;
  uchar *buffer_local;
  
  width = (ssize_t)&i;
  lStack_b8 = 0;
  local_bc = 0x78;
  for (ptr = (uchar *)0x0; (long)ptr < len; ptr = ptr + 1) {
    if (buffer[(long)ptr] == '\n') {
      curl_msnprintf((char *)width,(long)local_bc,"\\n");
      lStack_b8 = lStack_b8 + 2;
      width = width + 2;
      local_bc = local_bc + -2;
    }
    else if (buffer[(long)ptr] == '\r') {
      curl_msnprintf((char *)width,(long)local_bc,"\\r");
      lStack_b8 = lStack_b8 + 2;
      width = width + 2;
      local_bc = local_bc + -2;
    }
    else {
      iVar1 = Curl_isgraph((uint)buffer[(long)ptr]);
      if ((iVar1 == 0) && (buffer[(long)ptr] != ' ')) {
        local_d4 = 0x2e;
      }
      else {
        local_d4 = (uint)buffer[(long)ptr];
      }
      curl_msnprintf((char *)width,(long)local_bc,"%c",(ulong)local_d4);
      lStack_b8 = lStack_b8 + 1;
      width = width + 1;
      local_bc = local_bc + -1;
    }
    if (0x3c < lStack_b8) {
      logmsg("\'%s\'",&i);
      lStack_b8 = 0;
      width = (ssize_t)&i;
      local_bc = 0x78;
    }
  }
  if (lStack_b8 != 0) {
    logmsg("\'%s\'",&i);
  }
  return;
}

Assistant:

static void lograw(unsigned char *buffer, ssize_t len)
{
  char data[120];
  ssize_t i;
  unsigned char *ptr = buffer;
  char *optr = data;
  ssize_t width = 0;
  int left = sizeof(data);

  for(i = 0; i<len; i++) {
    switch(ptr[i]) {
    case '\n':
      snprintf(optr, left, "\\n");
      width += 2;
      optr += 2;
      left -= 2;
      break;
    case '\r':
      snprintf(optr, left, "\\r");
      width += 2;
      optr += 2;
      left -= 2;
      break;
    default:
      snprintf(optr, left, "%c", (ISGRAPH(ptr[i]) ||
                                  ptr[i] == 0x20) ?ptr[i]:'.');
      width++;
      optr++;
      left--;
      break;
    }

    if(width>60) {
      logmsg("'%s'", data);
      width = 0;
      optr = data;
      left = sizeof(data);
    }
  }
  if(width)
    logmsg("'%s'", data);
}